

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t2.c
# Opt level: O0

OPJ_BOOL opj_t2_read_packet_header
                   (opj_t2_t *p_t2,opj_tcd_tile_t *p_tile,opj_tcp_t *p_tcp,opj_pi_iterator_t *p_pi,
                   OPJ_BOOL *p_is_data_present,OPJ_BYTE *p_src_data,OPJ_UINT32 *p_data_read,
                   OPJ_UINT32 p_max_length,opj_packet_info_t *p_pack_info,opj_event_mgr_t *p_manager
                   )

{
  int iVar1;
  opj_cp_t *poVar2;
  opj_tcd_resolution_t *poVar3;
  OPJ_BOOL OVar4;
  OPJ_UINT32 OVar5;
  uint uVar6;
  OPJ_UINT32 OVar7;
  uint uVar8;
  OPJ_INT32 OVar9;
  long lVar10;
  opj_bio_t *bio;
  ptrdiff_t pVar11;
  OPJ_UINT32 local_e4;
  OPJ_UINT32 bit_number_1;
  OPJ_UINT32 bit_number;
  OPJ_UINT32 i;
  OPJ_INT32 n;
  OPJ_UINT32 l_segno;
  OPJ_UINT32 l_increment;
  OPJ_UINT32 l_included;
  opj_tcd_precinct_t *l_prc_1;
  opj_tcd_precinct_t *l_prc;
  opj_poc_t *poStack_a0;
  OPJ_UINT32 l_present;
  OPJ_BYTE **l_header_data_start;
  OPJ_BYTE *l_header_data;
  opj_tcd_resolution_t *l_res;
  opj_tcd_cblk_dec_t *l_cblk;
  opj_tcd_band_t *l_band;
  opj_bio_t *l_bio;
  opj_cp_t *l_cp;
  OPJ_BYTE *l_current_data;
  OPJ_UINT32 *l_modified_length_ptr;
  OPJ_UINT32 local_50;
  OPJ_UINT32 l_header_length;
  OPJ_UINT32 l_remaining_length;
  OPJ_UINT32 l_nb_code_blocks;
  OPJ_UINT32 cblkno;
  OPJ_UINT32 bandno;
  OPJ_BYTE *p_src_data_local;
  OPJ_BOOL *p_is_data_present_local;
  opj_pi_iterator_t *p_pi_local;
  opj_tcp_t *p_tcp_local;
  opj_tcd_tile_t *p_tile_local;
  opj_t2_t *p_t2_local;
  
  l_current_data = (OPJ_BYTE *)0x0;
  poVar2 = p_t2->cp;
  poVar3 = p_tile->comps[p_pi->compno].resolutions;
  uVar6 = p_pi->resno;
  l_cp = (opj_cp_t *)p_src_data;
  _cblkno = p_src_data;
  p_src_data_local = (OPJ_BYTE *)p_is_data_present;
  p_is_data_present_local = (OPJ_BOOL *)p_pi;
  p_pi_local = (opj_pi_iterator_t *)p_tcp;
  p_tcp_local = (opj_tcp_t *)p_tile;
  p_tile_local = (opj_tcd_tile_t *)p_t2;
  if (p_pi->layno == 0) {
    l_cblk = (opj_tcd_cblk_dec_t *)poVar3[uVar6].bands;
    for (l_nb_code_blocks = 0; l_nb_code_blocks < poVar3[uVar6].numbands;
        l_nb_code_blocks = l_nb_code_blocks + 1) {
      OVar4 = opj_tcd_is_band_empty((opj_tcd_band_t *)l_cblk);
      if (OVar4 == 0) {
        lVar10 = *(long *)&l_cblk->x1 + (ulong)(uint)p_is_data_present_local[0xb] * 0x38;
        if ((ulong)l_cblk->Mb / 0x38 <= (ulong)(uint)p_is_data_present_local[0xb]) {
          opj_event_msg(p_manager,1,"Invalid precinct\n");
          return 0;
        }
        opj_tgt_reset(*(opj_tgt_tree_t **)(lVar10 + 0x28));
        opj_tgt_reset(*(opj_tgt_tree_t **)(lVar10 + 0x30));
        l_res = *(opj_tcd_resolution_t **)(lVar10 + 0x18);
        l_header_length = *(int *)(lVar10 + 0x10) * *(int *)(lVar10 + 0x14);
        for (l_remaining_length = 0; l_remaining_length < l_header_length;
            l_remaining_length = l_remaining_length + 1) {
          l_res->bands[0].bandno = 0;
          *(undefined4 *)&l_res->bands[0].field_0x14 = 0;
          l_res = (opj_tcd_resolution_t *)(l_res->bands + 1);
        }
      }
      l_cblk = (opj_tcd_cblk_dec_t *)&l_cblk->numsegs;
    }
  }
  if (((undefined1  [256])*p_pi_local & (undefined1  [256])0x2) != (undefined1  [256])0x0) {
    if (p_max_length < 6) {
      opj_event_msg(p_manager,2,"Not enough space for expected SOP marker\n");
    }
    else if (((char)l_cp->rsiz == -1) && (*(char *)((long)&l_cp->rsiz + 1) == -0x6f)) {
      l_cp = (opj_cp_t *)((long)&l_cp->tx0 + 2);
    }
    else {
      opj_event_msg(p_manager,2,"Expected SOP marker\n");
    }
  }
  bio = opj_bio_create();
  if (bio == (opj_bio_t *)0x0) {
    p_t2_local._4_4_ = 0;
  }
  else {
    if ((poVar2->field_0x9c & 1) == 1) {
      poStack_a0 = (opj_poc_t *)&poVar2->ppm_data;
      l_header_data_start = *(OPJ_BYTE ***)poStack_a0;
      l_current_data = (OPJ_BYTE *)&poVar2->ppm_len;
    }
    else if (((byte)p_pi_local[0x16].poc.resno0 >> 1 & 1) == 1) {
      poStack_a0 = &p_pi_local[0x14].poc;
      l_header_data_start = *(OPJ_BYTE ***)poStack_a0;
      l_current_data = (OPJ_BYTE *)&p_pi_local[0x14].poc.layno0;
    }
    else {
      poStack_a0 = (opj_poc_t *)&l_cp;
      l_header_data_start = (OPJ_BYTE **)l_cp;
      local_50 = ((int)_cblkno + p_max_length) - (int)l_cp;
      l_current_data = (OPJ_BYTE *)&local_50;
    }
    opj_bio_init_dec(bio,(OPJ_BYTE *)l_header_data_start,*(OPJ_UINT32 *)l_current_data);
    OVar5 = opj_bio_read(bio,1);
    opj_null_jas_fprintf(_stderr,"present=%d \n",(ulong)OVar5);
    if (OVar5 == 0) {
      opj_bio_inalign(bio);
      pVar11 = opj_bio_numbytes(bio);
      l_header_data_start = (OPJ_BYTE **)(pVar11 + (long)l_header_data_start);
      opj_bio_destroy(bio);
      if (((undefined1  [256])*p_pi_local & (undefined1  [256])0x4) != (undefined1  [256])0x0) {
        if ((uint)(*(int *)l_current_data -
                  ((int)l_header_data_start - (int)*(opj_cp_t **)poStack_a0)) < 2) {
          opj_event_msg(p_manager,2,"Not enough space for expected EPH marker\n");
        }
        else if ((*(char *)l_header_data_start == -1) &&
                (*(char *)((long)l_header_data_start + 1) == -0x6e)) {
          l_header_data_start = (OPJ_BYTE **)((long)l_header_data_start + 2);
        }
        else {
          opj_event_msg(p_manager,2,"Expected EPH marker\n");
        }
      }
      uVar6 = (int)l_header_data_start - (int)*(opj_cp_t **)poStack_a0;
      *(uint *)l_current_data = *(int *)l_current_data - uVar6;
      *(opj_cp_t **)poStack_a0 =
           (opj_cp_t *)((long)&(*(opj_cp_t **)poStack_a0)->rsiz + (ulong)uVar6);
      if (p_pack_info != (opj_packet_info_t *)0x0) {
        p_pack_info->end_ph_pos = (long)(int)((int)l_cp - cblkno);
      }
      p_src_data_local[0] = '\0';
      p_src_data_local[1] = '\0';
      p_src_data_local[2] = '\0';
      p_src_data_local[3] = '\0';
      *p_data_read = (int)l_cp - cblkno;
      p_t2_local._4_4_ = 1;
    }
    else {
      l_cblk = (opj_tcd_cblk_dec_t *)poVar3[uVar6].bands;
      for (l_nb_code_blocks = 0; l_nb_code_blocks < poVar3[uVar6].numbands;
          l_nb_code_blocks = l_nb_code_blocks + 1) {
        lVar10 = *(long *)&l_cblk->x1 + (ulong)(uint)p_is_data_present_local[0xb] * 0x38;
        OVar4 = opj_tcd_is_band_empty((opj_tcd_band_t *)l_cblk);
        if (OVar4 == 0) {
          l_header_length = *(int *)(lVar10 + 0x10) * *(int *)(lVar10 + 0x14);
          l_res = *(opj_tcd_resolution_t **)(lVar10 + 0x18);
          for (l_remaining_length = 0; l_remaining_length < l_header_length;
              l_remaining_length = l_remaining_length + 1) {
            if (l_res->bands[0].bandno == 0) {
              l_segno = opj_tgt_decode(bio,*(opj_tgt_tree_t **)(lVar10 + 0x28),l_remaining_length,
                                       p_is_data_present_local[0xc] + 1);
            }
            else {
              l_segno = opj_bio_read(bio,1);
            }
            if (l_segno == 0) {
              l_res->bands[0].y1 = 0;
              opj_null_jas_fprintf(_stderr,"included=%d \n",0);
            }
            else {
              if (l_res->bands[0].bandno == 0) {
                bit_number_1 = 0;
                while (OVar5 = opj_tgt_decode(bio,*(opj_tgt_tree_t **)(lVar10 + 0x30),
                                              l_remaining_length,bit_number_1), OVar5 == 0) {
                  bit_number_1 = bit_number_1 + 1;
                }
                l_res->bands[0].x0 = l_cblk->numbps;
                l_res->bands[0].y0 = (l_cblk->numbps + 1) - bit_number_1;
                l_res->bands[0].x1 = 3;
              }
              OVar5 = opj_t2_getnumpasses(bio);
              l_res->bands[0].y1 = OVar5;
              OVar5 = opj_t2_getcommacode(bio);
              l_res->bands[0].x1 = OVar5 + l_res->bands[0].x1;
              i = 0;
              if (l_res->bands[0].bandno == 0) {
                OVar4 = opj_t2_init_seg((opj_tcd_cblk_dec_t *)l_res,0,
                                        *(OPJ_UINT32 *)
                                         (*(long *)&p_pi_local[0x15].tx1 +
                                          (ulong)(uint)p_is_data_present_local[9] * 0x438 + 0x10),1)
                ;
                if (OVar4 == 0) {
                  opj_bio_destroy(bio);
                  return 0;
                }
              }
              else {
                OVar7 = l_res->bands[0].bandno;
                i = OVar7 - 1;
                if ((*(int *)(*(long *)l_res + (ulong)i * 0x18 + 4) ==
                     *(int *)(*(long *)l_res + (ulong)i * 0x18 + 0xc)) &&
                   (OVar4 = opj_t2_init_seg((opj_tcd_cblk_dec_t *)l_res,OVar7,
                                            *(OPJ_UINT32 *)
                                             (*(long *)&p_pi_local[0x15].tx1 +
                                              (ulong)(uint)p_is_data_present_local[9] * 0x438 + 0x10
                                             ),0), i = OVar7, OVar4 == 0)) {
                  opj_bio_destroy(bio);
                  return 0;
                }
              }
              bit_number = l_res->bands[0].y1;
              if ((*(uint *)(*(long *)&p_pi_local[0x15].tx1 +
                             (ulong)(uint)p_is_data_present_local[9] * 0x438 + 0x10) & 0x40) == 0) {
                do {
                  OVar9 = opj_int_min(*(int *)(*(long *)l_res + (ulong)i * 0x18 + 0xc) -
                                      *(int *)(*(long *)l_res + (ulong)i * 0x18 + 4),bit_number);
                  *(OPJ_INT32 *)(*(long *)l_res + (ulong)i * 0x18 + 0x10) = OVar9;
                  iVar1 = l_res->bands[0].x1;
                  OVar7 = opj_uint_floorlog2(*(OPJ_UINT32 *)
                                              (*(long *)l_res + (ulong)i * 0x18 + 0x10));
                  uVar8 = iVar1 + OVar7;
                  if (0x20 < uVar8) {
                    opj_event_msg(p_manager,1,
                                  "Invalid bit number %d in opj_t2_read_packet_header()\n",
                                  (ulong)uVar8);
                    opj_bio_destroy(bio);
                    return 0;
                  }
                  OVar7 = opj_bio_read(bio,uVar8);
                  *(OPJ_UINT32 *)(*(long *)l_res + (ulong)i * 0x18 + 0x14) = OVar7;
                  opj_null_jas_fprintf
                            (_stderr,"included=%d numnewpasses=%d increment=%d len=%d \n",
                             (ulong)l_segno,
                             (ulong)*(uint *)(*(long *)l_res + (ulong)i * 0x18 + 0x10),(ulong)OVar5,
                             (ulong)*(uint *)(*(long *)l_res + (ulong)i * 0x18 + 0x14));
                  bit_number = bit_number - *(int *)(*(long *)l_res + (ulong)i * 0x18 + 0x10);
                  if (0 < (int)bit_number) {
                    i = i + 1;
                    OVar4 = opj_t2_init_seg((opj_tcd_cblk_dec_t *)l_res,i,
                                            *(OPJ_UINT32 *)
                                             (*(long *)&p_pi_local[0x15].tx1 +
                                              (ulong)(uint)p_is_data_present_local[9] * 0x438 + 0x10
                                             ),0);
                    if (OVar4 == 0) {
                      opj_bio_destroy(bio);
                      return 0;
                    }
                  }
                } while (0 < (int)bit_number);
              }
              else {
                do {
                  if (i == 0) {
                    local_e4 = 1;
                  }
                  else {
                    local_e4 = bit_number;
                  }
                  *(OPJ_UINT32 *)(*(long *)l_res + (ulong)i * 0x18 + 0x10) = local_e4;
                  iVar1 = l_res->bands[0].x1;
                  OVar7 = opj_uint_floorlog2(*(OPJ_UINT32 *)
                                              (*(long *)l_res + (ulong)i * 0x18 + 0x10));
                  uVar8 = iVar1 + OVar7;
                  if (0x20 < uVar8) {
                    opj_event_msg(p_manager,1,
                                  "Invalid bit number %d in opj_t2_read_packet_header()\n",
                                  (ulong)uVar8);
                    opj_bio_destroy(bio);
                    return 0;
                  }
                  OVar7 = opj_bio_read(bio,uVar8);
                  *(OPJ_UINT32 *)(*(long *)l_res + (ulong)i * 0x18 + 0x14) = OVar7;
                  opj_null_jas_fprintf
                            (_stderr,"included=%d numnewpasses=%d increment=%d len=%d \n",
                             (ulong)l_segno,
                             (ulong)*(uint *)(*(long *)l_res + (ulong)i * 0x18 + 0x10),(ulong)OVar5,
                             (ulong)*(uint *)(*(long *)l_res + (ulong)i * 0x18 + 0x14));
                  bit_number = bit_number - *(int *)(*(long *)l_res + (ulong)i * 0x18 + 0x10);
                  if (0 < (int)bit_number) {
                    i = i + 1;
                    OVar4 = opj_t2_init_seg((opj_tcd_cblk_dec_t *)l_res,i,
                                            *(OPJ_UINT32 *)
                                             (*(long *)&p_pi_local[0x15].tx1 +
                                              (ulong)(uint)p_is_data_present_local[9] * 0x438 + 0x10
                                             ),0);
                    if (OVar4 == 0) {
                      opj_bio_destroy(bio);
                      return 0;
                    }
                  }
                } while (0 < (int)bit_number);
              }
            }
            l_res = (opj_tcd_resolution_t *)(l_res->bands + 1);
          }
        }
        l_cblk = (opj_tcd_cblk_dec_t *)&l_cblk->numsegs;
      }
      OVar4 = opj_bio_inalign(bio);
      if (OVar4 == 0) {
        opj_bio_destroy(bio);
        p_t2_local._4_4_ = 0;
      }
      else {
        pVar11 = opj_bio_numbytes(bio);
        l_header_data_start = (OPJ_BYTE **)(pVar11 + (long)l_header_data_start);
        opj_bio_destroy(bio);
        if (((undefined1  [256])*p_pi_local & (undefined1  [256])0x4) != (undefined1  [256])0x0) {
          if ((uint)(*(int *)l_current_data -
                    ((int)l_header_data_start - (int)*(opj_cp_t **)poStack_a0)) < 2) {
            opj_event_msg(p_manager,2,"Not enough space for expected EPH marker\n");
          }
          else if ((*(char *)l_header_data_start == -1) &&
                  (*(char *)((long)l_header_data_start + 1) == -0x6e)) {
            l_header_data_start = (OPJ_BYTE **)((long)l_header_data_start + 2);
          }
          else {
            opj_event_msg(p_manager,2,"Expected EPH marker\n");
          }
        }
        l_modified_length_ptr._4_4_ = (int)l_header_data_start - (int)*(opj_cp_t **)poStack_a0;
        opj_null_jas_fprintf(_stderr,"hdrlen=%d \n",(ulong)l_modified_length_ptr._4_4_);
        opj_null_jas_fprintf(_stderr,"packet body\n");
        *(uint *)l_current_data = *(int *)l_current_data - l_modified_length_ptr._4_4_;
        *(opj_cp_t **)poStack_a0 =
             (opj_cp_t *)
             ((long)&(*(opj_cp_t **)poStack_a0)->rsiz + (ulong)l_modified_length_ptr._4_4_);
        if (p_pack_info != (opj_packet_info_t *)0x0) {
          p_pack_info->end_ph_pos = (long)(int)((int)l_cp - cblkno);
        }
        p_src_data_local[0] = '\x01';
        p_src_data_local[1] = '\0';
        p_src_data_local[2] = '\0';
        p_src_data_local[3] = '\0';
        *p_data_read = (int)l_cp - cblkno;
        p_t2_local._4_4_ = 1;
      }
    }
  }
  return p_t2_local._4_4_;
}

Assistant:

static OPJ_BOOL opj_t2_read_packet_header(opj_t2_t* p_t2,
        opj_tcd_tile_t *p_tile,
        opj_tcp_t *p_tcp,
        opj_pi_iterator_t *p_pi,
        OPJ_BOOL * p_is_data_present,
        OPJ_BYTE *p_src_data,
        OPJ_UINT32 * p_data_read,
        OPJ_UINT32 p_max_length,
        opj_packet_info_t *p_pack_info,
        opj_event_mgr_t *p_manager)

{
    /* loop */
    OPJ_UINT32 bandno, cblkno;
    OPJ_UINT32 l_nb_code_blocks;
    OPJ_UINT32 l_remaining_length;
    OPJ_UINT32 l_header_length;
    OPJ_UINT32 * l_modified_length_ptr = 00;
    OPJ_BYTE *l_current_data = p_src_data;
    opj_cp_t *l_cp = p_t2->cp;
    opj_bio_t *l_bio = 00;  /* BIO component */
    opj_tcd_band_t *l_band = 00;
    opj_tcd_cblk_dec_t* l_cblk = 00;
    opj_tcd_resolution_t* l_res =
        &p_tile->comps[p_pi->compno].resolutions[p_pi->resno];

    OPJ_BYTE *l_header_data = 00;
    OPJ_BYTE **l_header_data_start = 00;

    OPJ_UINT32 l_present;

    if (p_pi->layno == 0) {
        l_band = l_res->bands;

        /* reset tagtrees */
        for (bandno = 0; bandno < l_res->numbands; ++bandno) {
            if (!opj_tcd_is_band_empty(l_band)) {
                opj_tcd_precinct_t *l_prc = &l_band->precincts[p_pi->precno];
                if (!(p_pi->precno < (l_band->precincts_data_size / sizeof(
                                          opj_tcd_precinct_t)))) {
                    opj_event_msg(p_manager, EVT_ERROR, "Invalid precinct\n");
                    return OPJ_FALSE;
                }


                opj_tgt_reset(l_prc->incltree);
                opj_tgt_reset(l_prc->imsbtree);
                l_cblk = l_prc->cblks.dec;

                l_nb_code_blocks = l_prc->cw * l_prc->ch;
                for (cblkno = 0; cblkno < l_nb_code_blocks; ++cblkno) {
                    l_cblk->numsegs = 0;
                    l_cblk->real_num_segs = 0;
                    ++l_cblk;
                }
            }

            ++l_band;
        }
    }

    /* SOP markers */

    if (p_tcp->csty & J2K_CP_CSTY_SOP) {
        if (p_max_length < 6) {
            opj_event_msg(p_manager, EVT_WARNING,
                          "Not enough space for expected SOP marker\n");
        } else if ((*l_current_data) != 0xff || (*(l_current_data + 1) != 0x91)) {
            opj_event_msg(p_manager, EVT_WARNING, "Expected SOP marker\n");
        } else {
            l_current_data += 6;
        }

        /** TODO : check the Nsop value */
    }

    /*
    When the marker PPT/PPM is used the packet header are store in PPT/PPM marker
    This part deal with this characteristic
    step 1: Read packet header in the saved structure
    step 2: Return to codestream for decoding
    */

    l_bio = opj_bio_create();
    if (! l_bio) {
        return OPJ_FALSE;
    }

    if (l_cp->ppm == 1) { /* PPM */
        l_header_data_start = &l_cp->ppm_data;
        l_header_data = *l_header_data_start;
        l_modified_length_ptr = &(l_cp->ppm_len);

    } else if (p_tcp->ppt == 1) { /* PPT */
        l_header_data_start = &(p_tcp->ppt_data);
        l_header_data = *l_header_data_start;
        l_modified_length_ptr = &(p_tcp->ppt_len);
    } else { /* Normal Case */
        l_header_data_start = &(l_current_data);
        l_header_data = *l_header_data_start;
        l_remaining_length = (OPJ_UINT32)(p_src_data + p_max_length - l_header_data);
        l_modified_length_ptr = &(l_remaining_length);
    }

    opj_bio_init_dec(l_bio, l_header_data, *l_modified_length_ptr);

    l_present = opj_bio_read(l_bio, 1);
    JAS_FPRINTF(stderr, "present=%d \n", l_present);
    if (!l_present) {
        /* TODO MSD: no test to control the output of this function*/
        opj_bio_inalign(l_bio);
        l_header_data += opj_bio_numbytes(l_bio);
        opj_bio_destroy(l_bio);

        /* EPH markers */
        if (p_tcp->csty & J2K_CP_CSTY_EPH) {
            if ((*l_modified_length_ptr - (OPJ_UINT32)(l_header_data -
                    *l_header_data_start)) < 2U) {
                opj_event_msg(p_manager, EVT_WARNING,
                              "Not enough space for expected EPH marker\n");
            } else if ((*l_header_data) != 0xff || (*(l_header_data + 1) != 0x92)) {
                opj_event_msg(p_manager, EVT_WARNING, "Expected EPH marker\n");
            } else {
                l_header_data += 2;
            }
        }

        l_header_length = (OPJ_UINT32)(l_header_data - *l_header_data_start);
        *l_modified_length_ptr -= l_header_length;
        *l_header_data_start += l_header_length;

        /* << INDEX */
        /* End of packet header position. Currently only represents the distance to start of packet
           Will be updated later by incrementing with packet start value */
        if (p_pack_info) {
            p_pack_info->end_ph_pos = (OPJ_INT32)(l_current_data - p_src_data);
        }
        /* INDEX >> */

        * p_is_data_present = OPJ_FALSE;
        *p_data_read = (OPJ_UINT32)(l_current_data - p_src_data);
        return OPJ_TRUE;
    }

    l_band = l_res->bands;
    for (bandno = 0; bandno < l_res->numbands; ++bandno, ++l_band) {
        opj_tcd_precinct_t *l_prc = &(l_band->precincts[p_pi->precno]);

        if (opj_tcd_is_band_empty(l_band)) {
            continue;
        }

        l_nb_code_blocks = l_prc->cw * l_prc->ch;
        l_cblk = l_prc->cblks.dec;
        for (cblkno = 0; cblkno < l_nb_code_blocks; cblkno++) {
            OPJ_UINT32 l_included, l_increment, l_segno;
            OPJ_INT32 n;

            /* if cblk not yet included before --> inclusion tagtree */
            if (!l_cblk->numsegs) {
                l_included = opj_tgt_decode(l_bio, l_prc->incltree, cblkno,
                                            (OPJ_INT32)(p_pi->layno + 1));
                /* else one bit */
            } else {
                l_included = opj_bio_read(l_bio, 1);
            }

            /* if cblk not included */
            if (!l_included) {
                l_cblk->numnewpasses = 0;
                ++l_cblk;
                JAS_FPRINTF(stderr, "included=%d \n", l_included);
                continue;
            }

            /* if cblk not yet included --> zero-bitplane tagtree */
            if (!l_cblk->numsegs) {
                OPJ_UINT32 i = 0;

                while (!opj_tgt_decode(l_bio, l_prc->imsbtree, cblkno, (OPJ_INT32)i)) {
                    ++i;
                }

                l_cblk->Mb = (OPJ_UINT32)l_band->numbps;
                l_cblk->numbps = (OPJ_UINT32)l_band->numbps + 1 - i;
                l_cblk->numlenbits = 3;
            }

            /* number of coding passes */
            l_cblk->numnewpasses = opj_t2_getnumpasses(l_bio);
            l_increment = opj_t2_getcommacode(l_bio);

            /* length indicator increment */
            l_cblk->numlenbits += l_increment;
            l_segno = 0;

            if (!l_cblk->numsegs) {
                if (! opj_t2_init_seg(l_cblk, l_segno, p_tcp->tccps[p_pi->compno].cblksty, 1)) {
                    opj_bio_destroy(l_bio);
                    return OPJ_FALSE;
                }
            } else {
                l_segno = l_cblk->numsegs - 1;
                if (l_cblk->segs[l_segno].numpasses == l_cblk->segs[l_segno].maxpasses) {
                    ++l_segno;
                    if (! opj_t2_init_seg(l_cblk, l_segno, p_tcp->tccps[p_pi->compno].cblksty, 0)) {
                        opj_bio_destroy(l_bio);
                        return OPJ_FALSE;
                    }
                }
            }
            n = (OPJ_INT32)l_cblk->numnewpasses;

            if ((p_tcp->tccps[p_pi->compno].cblksty & J2K_CCP_CBLKSTY_HT) != 0)
                do {
                    OPJ_UINT32 bit_number;
                    l_cblk->segs[l_segno].numnewpasses = l_segno == 0 ? 1 : (OPJ_UINT32)n;
                    bit_number = l_cblk->numlenbits + opj_uint_floorlog2(
                                     l_cblk->segs[l_segno].numnewpasses);
                    if (bit_number > 32) {
                        opj_event_msg(p_manager, EVT_ERROR,
                                      "Invalid bit number %d in opj_t2_read_packet_header()\n",
                                      bit_number);
                        opj_bio_destroy(l_bio);
                        return OPJ_FALSE;
                    }
                    l_cblk->segs[l_segno].newlen = opj_bio_read(l_bio, bit_number);
                    JAS_FPRINTF(stderr, "included=%d numnewpasses=%d increment=%d len=%d \n",
                                l_included, l_cblk->segs[l_segno].numnewpasses, l_increment,
                                l_cblk->segs[l_segno].newlen);

                    n -= (OPJ_INT32)l_cblk->segs[l_segno].numnewpasses;
                    if (n > 0) {
                        ++l_segno;

                        if (! opj_t2_init_seg(l_cblk, l_segno, p_tcp->tccps[p_pi->compno].cblksty, 0)) {
                            opj_bio_destroy(l_bio);
                            return OPJ_FALSE;
                        }
                    }
                } while (n > 0);
            else
                do {
                    OPJ_UINT32 bit_number;
                    l_cblk->segs[l_segno].numnewpasses = (OPJ_UINT32)opj_int_min((OPJ_INT32)(
                            l_cblk->segs[l_segno].maxpasses - l_cblk->segs[l_segno].numpasses), n);
                    bit_number = l_cblk->numlenbits + opj_uint_floorlog2(
                                     l_cblk->segs[l_segno].numnewpasses);
                    if (bit_number > 32) {
                        opj_event_msg(p_manager, EVT_ERROR,
                                      "Invalid bit number %d in opj_t2_read_packet_header()\n",
                                      bit_number);
                        opj_bio_destroy(l_bio);
                        return OPJ_FALSE;
                    }
                    l_cblk->segs[l_segno].newlen = opj_bio_read(l_bio, bit_number);
                    JAS_FPRINTF(stderr, "included=%d numnewpasses=%d increment=%d len=%d \n",
                                l_included, l_cblk->segs[l_segno].numnewpasses, l_increment,
                                l_cblk->segs[l_segno].newlen);

                    n -= (OPJ_INT32)l_cblk->segs[l_segno].numnewpasses;
                    if (n > 0) {
                        ++l_segno;

                        if (! opj_t2_init_seg(l_cblk, l_segno, p_tcp->tccps[p_pi->compno].cblksty, 0)) {
                            opj_bio_destroy(l_bio);
                            return OPJ_FALSE;
                        }
                    }
                } while (n > 0);

            ++l_cblk;
        }
    }

    if (!opj_bio_inalign(l_bio)) {
        opj_bio_destroy(l_bio);
        return OPJ_FALSE;
    }

    l_header_data += opj_bio_numbytes(l_bio);
    opj_bio_destroy(l_bio);

    /* EPH markers */
    if (p_tcp->csty & J2K_CP_CSTY_EPH) {
        if ((*l_modified_length_ptr - (OPJ_UINT32)(l_header_data -
                *l_header_data_start)) < 2U) {
            opj_event_msg(p_manager, EVT_WARNING,
                          "Not enough space for expected EPH marker\n");
        } else if ((*l_header_data) != 0xff || (*(l_header_data + 1) != 0x92)) {
            opj_event_msg(p_manager, EVT_WARNING, "Expected EPH marker\n");
        } else {
            l_header_data += 2;
        }
    }

    l_header_length = (OPJ_UINT32)(l_header_data - *l_header_data_start);
    JAS_FPRINTF(stderr, "hdrlen=%d \n", l_header_length);
    JAS_FPRINTF(stderr, "packet body\n");
    *l_modified_length_ptr -= l_header_length;
    *l_header_data_start += l_header_length;

    /* << INDEX */
    /* End of packet header position. Currently only represents the distance to start of packet
     Will be updated later by incrementing with packet start value */
    if (p_pack_info) {
        p_pack_info->end_ph_pos = (OPJ_INT32)(l_current_data - p_src_data);
    }
    /* INDEX >> */

    *p_is_data_present = OPJ_TRUE;
    *p_data_read = (OPJ_UINT32)(l_current_data - p_src_data);

    return OPJ_TRUE;
}